

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_23de0c::PulseMainloop::waitForOperation
          (PulseMainloop *this,pa_operation *op,unique_lock<std::mutex> *plock)

{
  condition_variable *in_RDX;
  unique_lock<std::mutex> *in_RSI;
  
  if (in_RSI != (unique_lock<std::mutex> *)0x0) {
    std::condition_variable::
    wait<(anonymous_namespace)::PulseMainloop::waitForOperation(pa_operation*,std::unique_lock<std::mutex>&)::_lambda()_1_>
              (in_RDX,in_RSI,(anon_class_8_1_3fcf669f)in_RSI);
    (*(anonymous_namespace)::ppa_operation_unref)(in_RSI);
  }
  return;
}

Assistant:

void waitForOperation(pa_operation *op, std::unique_lock<std::mutex> &plock)
    {
        if(op)
        {
            mCondVar.wait(plock,
                [op]() -> bool { return pa_operation_get_state(op) != PA_OPERATION_RUNNING; });
            pa_operation_unref(op);
        }
    }